

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

void Llb_ManResultPrint(Aig_Man_t *p,Vec_Ptr_t *vResult)

{
  int i;
  bool bVar1;
  Vec_Ptr_t *vLower;
  int iVar2;
  Vec_Ptr_t *vUpper;
  
  vLower = (Vec_Ptr_t *)0x0;
  iVar2 = vResult->nSize;
  while (vUpper = vLower, 0 < iVar2) {
    i = iVar2 + -1;
    vLower = (Vec_Ptr_t *)Vec_PtrEntry(vResult,i);
    bVar1 = iVar2 < vResult->nSize;
    iVar2 = i;
    if (bVar1) {
      Llb_ManCutPrint(p,vLower,vUpper);
    }
  }
  return;
}

Assistant:

void Llb_ManResultPrint( Aig_Man_t * p, Vec_Ptr_t * vResult )
{
    Vec_Ptr_t * vLower, * vUpper = NULL;
    int i;
    Vec_PtrForEachEntryReverse( Vec_Ptr_t *, vResult, vLower, i )
    {
        if ( i < Vec_PtrSize(vResult) - 1 )
            Llb_ManCutPrint( p, vLower, vUpper );
        vUpper = vLower;
    }
}